

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O2

void util::Xor(Span<std::byte> write,Span<const_std::byte> key,size_t key_offset)

{
  byte *pbVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  size_t i;
  size_t sVar5;
  long in_FS_OFFSET;
  
  uVar3 = key.m_size;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (uVar3 != 0) {
    uVar4 = key_offset % uVar3;
    for (sVar5 = 0; write.m_size != sVar5; sVar5 = sVar5 + 1) {
      pbVar1 = key.m_data + uVar4;
      uVar4 = uVar4 + 1;
      write.m_data[sVar5] = write.m_data[sVar5] ^ *pbVar1;
      if (uVar4 == uVar3) {
        uVar4 = 0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void Xor(Span<std::byte> write, Span<const std::byte> key, size_t key_offset = 0)
{
    if (key.size() == 0) {
        return;
    }
    key_offset %= key.size();

    for (size_t i = 0, j = key_offset; i != write.size(); i++) {
        write[i] ^= key[j++];

        // This potentially acts on very many bytes of data, so it's
        // important that we calculate `j`, i.e. the `key` index in this
        // way instead of doing a %, which would effectively be a division
        // for each byte Xor'd -- much slower than need be.
        if (j == key.size())
            j = 0;
    }
}